

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int process_marker(jpeg *z,int m)

{
  huffman *phVar1;
  uint8 uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int th;
  int tc;
  int q_1;
  int m_1;
  int i_1;
  int sizes [16];
  uint8 *v;
  int i;
  int t;
  int p;
  int q;
  int L;
  int m_local;
  jpeg *z_local;
  
  if (m == 0xc2) {
    z_local._4_4_ = e("JPEG format not supported (progressive)");
  }
  else if (m == 0xc4) {
    iVar5 = get16(&z->s);
    for (p = iVar5 + -2; 0 < p; p = (p + -0x11) - tc) {
      tc = 0;
      uVar3 = get8(&z->s);
      uVar4 = uVar3 & 0xf;
      if ((1 < (int)uVar3 >> 4) || (3 < uVar4)) {
        iVar5 = e("Corrupt JPEG");
        return iVar5;
      }
      for (q_1 = 0; q_1 < 0x10; q_1 = q_1 + 1) {
        iVar5 = get8(&z->s);
        (&m_1)[q_1] = iVar5;
        tc = (&m_1)[q_1] + tc;
      }
      if ((int)uVar3 >> 4 == 0) {
        iVar5 = build_huffman(z->huff_dc + (int)uVar4,&m_1);
        if (iVar5 == 0) {
          return 0;
        }
        phVar1 = z->huff_dc + (int)uVar4;
      }
      else {
        iVar5 = build_huffman(z->huff_ac + (int)uVar4,&m_1);
        if (iVar5 == 0) {
          return 0;
        }
        phVar1 = z->huff_ac + (int)uVar4;
      }
      sizes._56_8_ = phVar1->values;
      for (q_1 = 0; q_1 < tc; q_1 = q_1 + 1) {
        uVar2 = get8u(&z->s);
        *(uint8 *)(sizes._56_8_ + (long)q_1) = uVar2;
      }
    }
    z_local._4_4_ = (uint)(p == 0);
  }
  else if (m == 0xdb) {
    iVar5 = get16(&z->s);
    for (p = iVar5 + -2; 0 < p; p = p + -0x41) {
      uVar3 = get8(&z->s);
      if ((int)uVar3 >> 4 != 0) {
        iVar5 = e("Corrupt JPEG");
        return iVar5;
      }
      if (3 < (uVar3 & 0xf)) {
        iVar5 = e("Corrupt JPEG");
        return iVar5;
      }
      for (v._0_4_ = 0; (int)v < 0x40; v._0_4_ = (int)v + 1) {
        uVar2 = get8u(&z->s);
        z->dequant[(int)(uVar3 & 0xf)][dezigzag[(int)v]] = uVar2;
      }
    }
    z_local._4_4_ = (uint)(p == 0);
  }
  else if (m == 0xdd) {
    iVar5 = get16(&z->s);
    if (iVar5 == 4) {
      iVar5 = get16(&z->s);
      z->restart_interval = iVar5;
      z_local._4_4_ = 1;
    }
    else {
      z_local._4_4_ = e("Corrupt JPEG");
    }
  }
  else if (m == 0xff) {
    z_local._4_4_ = e("Corrupt JPEG");
  }
  else if (((m < 0xe0) || (0xef < m)) && (m != 0xfe)) {
    z_local._4_4_ = 0;
  }
  else {
    iVar5 = get16(&z->s);
    skip(&z->s,iVar5 + -2);
    z_local._4_4_ = 1;
  }
  return z_local._4_4_;
}

Assistant:

static int process_marker(jpeg *z, int m)
{
   int L;
   switch (m) {
      case MARKER_none: // no marker found
         return e("expected marker","Corrupt JPEG");

      case 0xC2: // SOF - progressive
         return e("progressive jpeg","JPEG format not supported (progressive)");

      case 0xDD: // DRI - specify restart interval
         if (get16(&z->s) != 4) return e("bad DRI len","Corrupt JPEG");
         z->restart_interval = get16(&z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = get16(&z->s)-2;
         while (L > 0) {
            int q = get8(&z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return e("bad DQT type","Corrupt JPEG");
            if (t > 3) return e("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][dezigzag[i]] = get8u(&z->s);
            #if STBI_SIMD
            for (i=0; i < 64; ++i)
               z->dequant2[t][i] = dequant[t][i];
            #endif
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = get16(&z->s)-2;
         while (L > 0) {
            uint8 *v;
            int sizes[16],i,m=0;
            int q = get8(&z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return e("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = get8(&z->s);
               m += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < m; ++i)
               v[i] = get8u(&z->s);
            L -= m;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      skip(&z->s, get16(&z->s)-2);
      return 1;
   }
   return 0;
}